

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O2

DWORD __thiscall FArchive::ReadCount(FArchive *this)

{
  uint uVar1;
  byte bVar2;
  BYTE in;
  
  uVar1 = 0;
  bVar2 = 0;
  do {
    (*this->_vptr_FArchive[3])(this,&in,1);
    uVar1 = uVar1 | (in & 0x7f) << (bVar2 & 0x1f);
    bVar2 = bVar2 + 7;
  } while ((char)in < '\0');
  return uVar1;
}

Assistant:

DWORD FArchive::ReadCount ()
{
	BYTE in;
	DWORD count = 0;
	int ofs = 0;

	do
	{
		Read (&in, sizeof(BYTE));
		count |= (in & 0x7f) << ofs;
		ofs += 7;
	} while (in & 0x80);

	return count;
}